

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_> *
loadDirectory(vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_> *__return_storage_ptr__,char *path)

{
  bool bVar1;
  DIR *__dirp;
  dirent *pdVar2;
  ostream *poVar3;
  SVG *pSVar4;
  char *pcVar5;
  ulong uVar6;
  SVG *svg;
  string pathname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string filename;
  string filesufx;
  
  __dirp = opendir(path);
  (__return_storage_ptr__->super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (__dirp == (DIR *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"[Drawer] ");
    poVar3 = std::operator<<(poVar3,"Could not open directory");
    poVar3 = std::operator<<(poVar3,path);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pathname,path,(allocator<char> *)&filename);
    if (pathname._M_dataplus._M_p[pathname._M_string_length - 1] != '/') {
      std::__cxx11::string::push_back((char)&pathname);
    }
    uVar6 = 0;
    while( true ) {
      pdVar2 = readdir(__dirp);
      if ((pdVar2 == (dirent *)0x0) || (8 < uVar6)) break;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&filename,pdVar2->d_name,(allocator<char> *)&filesufx);
      std::__cxx11::string::find_last_of((char *)&filename,0x1a73e2);
      std::__cxx11::string::substr((ulong)&filesufx,(ulong)&filename);
      bVar1 = std::operator==(&filesufx,"svg");
      if (bVar1) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"[Drawer] Loading ");
        poVar3 = std::operator<<(poVar3,(string *)&filename);
        std::operator<<(poVar3,"... ");
        std::operator+(&local_90,&pathname,&filename);
        pSVar4 = loadFile(local_90._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_90);
        svg = pSVar4;
        if (pSVar4 == (SVG *)0x0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Failed (Invalid SVG file)");
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Succeeded");
          std::endl<char,std::char_traits<char>>(poVar3);
          std::vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>::push_back
                    (__return_storage_ptr__,&svg);
          uVar6 = uVar6 + 1;
        }
      }
      std::__cxx11::string::~string((string *)&filesufx);
      std::__cxx11::string::~string((string *)&filename);
    }
    closedir(__dirp);
    if (uVar6 == 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"[Drawer] ");
      pcVar5 = "No valid svg files found in ";
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"[Drawer] ");
      poVar3 = std::operator<<(poVar3,"Successfully Loaded ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      pcVar5 = " files from ";
    }
    poVar3 = std::operator<<(poVar3,pcVar5);
    poVar3 = std::operator<<(poVar3,path);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&pathname);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<SVG*> loadDirectory( const char* path ) {

  DIR *dir = opendir (path);
  vector<SVG*> svgs;
  if(dir) {
    
    struct dirent *ent; size_t n = 0;
    
    // load files
    string pathname = path; 
    if (pathname[pathname.size()-1] != '/') pathname.push_back('/');
    while (((ent = readdir (dir)) != NULL) && (n < 9)) {

      string filename = ent->d_name;
      string filesufx = filename.substr(filename.find_last_of(".") + 1, 3);
      if (filesufx == "svg" ) {
        cerr << "[Drawer] Loading " << filename << "... "; 
        SVG *svg = loadFile((pathname + filename).c_str());
        if (!svg) {
          cerr << "Failed (Invalid SVG file)" << endl;
        } else {
          cerr << "Succeeded" << endl;
          svgs.push_back(svg);
          n++;
        }
      }
    }

    closedir (dir);

    if (n) {
      msg("Successfully Loaded " << n << " files from " << path);
      return svgs;
    }

    msg("No valid svg files found in " << path);
    return svgs;
  } 

  msg("Could not open directory" << path);
  return svgs;
}